

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EAM.hpp
# Opt level: O0

void __thiscall OpenMD::EAM::~EAM(EAM *this)

{
  undefined8 *in_RDI;
  vector<OpenMD::EAMAtomData,_std::allocator<OpenMD::EAMAtomData>_> *unaff_retaddr;
  
  *in_RDI = &PTR__EAM_005122e0;
  std::__cxx11::string::~string((string *)(in_RDI + 0x20));
  std::set<OpenMD::AtomType_*,_OpenMD::AtomTypeCompare,_std::allocator<OpenMD::AtomType_*>_>::~set
            ((set<OpenMD::AtomType_*,_OpenMD::AtomTypeCompare,_std::allocator<OpenMD::AtomType_*>_>
              *)0x3c023e);
  std::
  vector<std::vector<OpenMD::EAMInteractionData,_std::allocator<OpenMD::EAMInteractionData>_>,_std::allocator<std::vector<OpenMD::EAMInteractionData,_std::allocator<OpenMD::EAMInteractionData>_>_>_>
  ::~vector((vector<std::vector<OpenMD::EAMInteractionData,_std::allocator<OpenMD::EAMInteractionData>_>,_std::allocator<std::vector<OpenMD::EAMInteractionData,_std::allocator<OpenMD::EAMInteractionData>_>_>_>
             *)unaff_retaddr);
  std::vector<OpenMD::EAMAtomData,_std::allocator<OpenMD::EAMAtomData>_>::~vector(unaff_retaddr);
  std::vector<int,_std::allocator<int>_>::~vector
            ((vector<int,_std::allocator<int>_> *)unaff_retaddr);
  std::set<int,_std::less<int>,_std::allocator<int>_>::~set
            ((set<int,_std::less<int>,_std::allocator<int>_> *)0x3c0276);
  MetallicInteraction::~MetallicInteraction((MetallicInteraction *)0x3c0280);
  return;
}

Assistant:

void setForceField(ForceField* ff) { forceField_ = ff; }